

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

void __thiscall
Database::collect_garbage
          (Database *this,
          set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
          *working_snapshots)

{
  pointer ppOVar1;
  undefined8 *puVar2;
  pointer puVar3;
  pointer pbVar4;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  undefined8 *puVar8;
  unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *set;
  pointer ppOVar9;
  pointer puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  drop_list;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required_datasets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppOVar9 = (this->working_datasets).
            super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar1 = (this->working_datasets).
            super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppOVar9 != ppOVar1) {
    do {
      psVar5 = OnDiskDataset::get_name_abi_cxx11_(*ppOVar9);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_60,psVar5);
      ppOVar9 = ppOVar9 + 1;
    } while (ppOVar9 != ppOVar1);
  }
  p_Var6 = *(_Rb_tree_node_base **)(working_snapshots + 0x18);
  if (p_Var6 != (_Rb_tree_node_base *)(working_snapshots + 8)) {
    do {
      puVar2 = *(undefined8 **)(*(long *)(p_Var6 + 1) + 200);
      for (puVar8 = *(undefined8 **)(*(long *)(p_Var6 + 1) + 0xc0); puVar8 != puVar2;
          puVar8 = puVar8 + 1) {
        psVar5 = OnDiskDataset::get_name_abi_cxx11_((OnDiskDataset *)*puVar8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,psVar5);
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)(working_snapshots + 8));
  }
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar10 = (this->loaded_datasets).
            super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->loaded_datasets).
           super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar3) {
    do {
      psVar5 = OnDiskDataset::get_name_abi_cxx11_
                         ((puVar10->_M_t).
                          super___uniq_ptr_impl<OnDiskDataset,_std::default_delete<OnDiskDataset>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_OnDiskDataset_*,_std::default_delete<OnDiskDataset>_>
                          .super__Head_base<0UL,_OnDiskDataset_*,_false>._M_head_impl);
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_60,psVar5);
      if ((_Rb_tree_header *)cVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
        psVar5 = OnDiskDataset::get_name_abi_cxx11_
                           ((puVar10->_M_t).
                            super___uniq_ptr_impl<OnDiskDataset,_std::default_delete<OnDiskDataset>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OnDiskDataset_*,_std::default_delete<OnDiskDataset>_>
                            .super__Head_base<0UL,_OnDiskDataset_*,_false>._M_head_impl);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_78,psVar5);
      }
      pbVar4 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar10 = puVar10 + 1;
      psVar5 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (puVar10 != puVar3);
    for (; psVar5 != pbVar4; psVar5 = psVar5 + 1) {
      destroy_dataset(this,psVar5);
    }
  }
  collect_stale_iterators(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Database::collect_garbage(
    std::set<DatabaseSnapshot *> &working_snapshots) {
    std::set<std::string> required_datasets;

    for (const auto *ds : working_sets()) {
        required_datasets.insert(ds->get_name());
    }

    for (const auto *snap : working_snapshots) {
        for (const auto *ds : snap->get_datasets()) {
            required_datasets.insert(ds->get_name());
        }
    }

    std::vector<std::string> drop_list;
    for (const auto &set : loaded_sets()) {
        if (required_datasets.count(set->get_name()) == 0) {
            // set is loaded but not required
            drop_list.push_back(set->get_name());
        }
    }

    for (const auto &ds : drop_list) {
        destroy_dataset(ds);
    }

    collect_stale_iterators();
}